

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_grzip.c
# Opt level: O0

int archive_read_support_filter_grzip(archive *_a)

{
  int iVar1;
  archive_read_filter_bidder *paStack_28;
  int magic_test;
  archive_read_filter_bidder *reader;
  archive_read *a;
  archive *_a_local;
  
  reader = (archive_read_filter_bidder *)_a;
  a = (archive_read *)_a;
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_support_filter_grzip");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    iVar1 = __archive_read_get_bidder((archive_read *)reader,&stack0xffffffffffffffd8);
    if (iVar1 == 0) {
      paStack_28->data = (void *)0x0;
      paStack_28->bid = grzip_bidder_bid;
      paStack_28->init = grzip_bidder_init;
      paStack_28->options = (_func_int_archive_read_filter_bidder_ptr_char_ptr_char_ptr *)0x0;
      paStack_28->free = grzip_reader_free;
      archive_set_error(&a->archive,-1,"Using external grzip program for grzip decompression");
      _a_local._4_4_ = -0x14;
    }
    else {
      _a_local._4_4_ = -0x1e;
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_support_filter_grzip(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter_bidder *reader;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_filter_grzip");

	if (__archive_read_get_bidder(a, &reader) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	reader->data = NULL;
	reader->bid = grzip_bidder_bid;
	reader->init = grzip_bidder_init;
	reader->options = NULL;
	reader->free = grzip_reader_free;
	/* This filter always uses an external program. */
	archive_set_error(_a, ARCHIVE_ERRNO_MISC,
	    "Using external grzip program for grzip decompression");
	return (ARCHIVE_WARN);
}